

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall btCollisionWorld::~btCollisionWorld(btCollisionWorld *this)

{
  btCollisionObject *this_00;
  int iVar1;
  btCollisionObject **ppbVar2;
  btBroadphaseProxy *pbVar3;
  btBroadphaseInterface *pbVar4;
  undefined4 extraout_var;
  btCollisionWorld *in_RDI;
  btBroadphaseProxy *bp;
  btCollisionObject *collisionObject;
  int i;
  int local_c;
  
  in_RDI->_vptr_btCollisionWorld = (_func_int **)&PTR__btCollisionWorld_002e27b8;
  local_c = 0;
  while( true ) {
    iVar1 = btAlignedObjectArray<btCollisionObject_*>::size(&in_RDI->m_collisionObjects);
    if (iVar1 <= local_c) break;
    ppbVar2 = btAlignedObjectArray<btCollisionObject_*>::operator[]
                        (&in_RDI->m_collisionObjects,local_c);
    this_00 = *ppbVar2;
    pbVar3 = btCollisionObject::getBroadphaseHandle(this_00);
    if (pbVar3 != (btBroadphaseProxy *)0x0) {
      pbVar4 = getBroadphase(in_RDI);
      iVar1 = (*pbVar4->_vptr_btBroadphaseInterface[9])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                ((long *)CONCAT44(extraout_var,iVar1),pbVar3,in_RDI->m_dispatcher1);
      pbVar4 = getBroadphase(in_RDI);
      (*pbVar4->_vptr_btBroadphaseInterface[3])(pbVar4,pbVar3,in_RDI->m_dispatcher1);
      btCollisionObject::setBroadphaseHandle(this_00,(btBroadphaseProxy *)0x0);
    }
    local_c = local_c + 1;
  }
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray
            ((btAlignedObjectArray<btCollisionObject_*> *)0x17a2c5);
  return;
}

Assistant:

btCollisionWorld::~btCollisionWorld()
{

	//clean up remaining objects
	int i;
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* collisionObject= m_collisionObjects[i];

		btBroadphaseProxy* bp = collisionObject->getBroadphaseHandle();
		if (bp)
		{
			//
			// only clear the cached algorithms
			//
			getBroadphase()->getOverlappingPairCache()->cleanProxyFromPairs(bp,m_dispatcher1);
			getBroadphase()->destroyProxy(bp,m_dispatcher1);
			collisionObject->setBroadphaseHandle(0);
		}
	}


}